

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void __thiscall VmBlock::AddInstruction(VmBlock *this,VmInstruction *instruction)

{
  VmInstruction *instruction_local;
  VmBlock *this_local;
  
  if (instruction == (VmInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7c2,"void VmBlock::AddInstruction(VmInstruction *)");
  }
  if (instruction->parent != (VmBlock *)0x0) {
    __assert_fail("instruction->parent == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7c3,"void VmBlock::AddInstruction(VmInstruction *)");
  }
  if (instruction->prevSibling != (VmInstruction *)0x0) {
    __assert_fail("instruction->prevSibling == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7c4,"void VmBlock::AddInstruction(VmInstruction *)");
  }
  if (instruction->nextSibling != (VmInstruction *)0x0) {
    __assert_fail("instruction->nextSibling == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7c5,"void VmBlock::AddInstruction(VmInstruction *)");
  }
  instruction->parent = this;
  if (this->firstInstruction == (VmInstruction *)0x0) {
    if (this->insertPoint != (VmInstruction *)0x0) {
      __assert_fail("!insertPoint",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x7cb,"void VmBlock::AddInstruction(VmInstruction *)");
    }
    this->lastInstruction = instruction;
    this->firstInstruction = instruction;
  }
  else if (this->insertPoint == (VmInstruction *)0x0) {
    instruction->nextSibling = this->firstInstruction;
    this->firstInstruction->prevSibling = instruction;
    this->firstInstruction = instruction;
  }
  else {
    if (this->insertPoint == (VmInstruction *)0x0) {
      __assert_fail("insertPoint",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x7d9,"void VmBlock::AddInstruction(VmInstruction *)");
    }
    if (this->insertPoint->nextSibling != (VmInstruction *)0x0) {
      this->insertPoint->nextSibling->prevSibling = instruction;
    }
    instruction->nextSibling = this->insertPoint->nextSibling;
    this->insertPoint->nextSibling = instruction;
    instruction->prevSibling = this->insertPoint;
    if (this->insertPoint == this->lastInstruction) {
      this->lastInstruction = instruction;
    }
  }
  if ((instruction->prevSibling != (VmInstruction *)0x0) &&
     (instruction->prevSibling->parent != this)) {
    __assert_fail("instruction->prevSibling->parent == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7e8,"void VmBlock::AddInstruction(VmInstruction *)");
  }
  if ((instruction->nextSibling != (VmInstruction *)0x0) &&
     (instruction->nextSibling->parent != this)) {
    __assert_fail("instruction->nextSibling->parent == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7eb,"void VmBlock::AddInstruction(VmInstruction *)");
  }
  this->insertPoint = instruction;
  return;
}

Assistant:

void VmBlock::AddInstruction(VmInstruction* instruction)
{
	assert(instruction);
	assert(instruction->parent == NULL);
	assert(instruction->prevSibling == NULL);
	assert(instruction->nextSibling == NULL);

	instruction->parent = this;

	if(!firstInstruction)
	{
		assert(!insertPoint);

		firstInstruction = lastInstruction = instruction;
	}
	else if(!insertPoint)
	{
		instruction->nextSibling = firstInstruction;

		firstInstruction->prevSibling = instruction;

		firstInstruction = instruction;
	}
	else
	{
		assert(insertPoint);

		if(insertPoint->nextSibling)
			insertPoint->nextSibling->prevSibling = instruction;

		instruction->nextSibling = insertPoint->nextSibling;

		insertPoint->nextSibling = instruction;
		instruction->prevSibling = insertPoint;

		if(insertPoint == lastInstruction)
			lastInstruction = instruction;
	}

	if(instruction->prevSibling)
		assert(instruction->prevSibling->parent == this);

	if(instruction->nextSibling)
		assert(instruction->nextSibling->parent == this);

	insertPoint = instruction;
}